

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  pointer *pppFVar1;
  FieldDescriptor FVar2;
  pointer ppFVar3;
  cpp *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *field;
  iterator __position;
  pointer puVar4;
  __uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
  _Var5;
  undefined4 uVar6;
  pointer pvVar7;
  bool bVar8;
  FileOptions_OptimizeMode FVar9;
  int iVar10;
  int iVar11;
  uint32_t uVar12;
  FieldGenerator *pFVar13;
  LogMessage *pLVar14;
  pointer ppFVar15;
  AnnotationCollector *pAVar16;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar17;
  uint32_t uVar18;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar19;
  FieldDescriptor *field_00;
  long lVar20;
  pointer puVar21;
  byte bVar22;
  int iVar23;
  iterator __first;
  const_iterator __end4;
  long lVar24;
  char *format_00;
  Descriptor *pDVar25;
  long lVar26;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  int *cached_has_word_index_00;
  size_type in_R9;
  const_iterator __begin4;
  AnnotationCollector *pAVar27;
  Options *pOVar28;
  ulong uVar29;
  iterator __position_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Hex hex;
  StringPiece has_bits_var;
  int cached_has_word_index;
  Formatter format;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  string chunk_mask_str;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  Iterator __begin4_1;
  ColdChunkSkipper cold_skipper;
  Iterator __end3;
  Iterator __end4_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  undefined1 local_1c4 [16];
  undefined4 local_1b4;
  Formatter local_1b0;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  local_178;
  Options *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  FieldGeneratorMap *local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [56];
  undefined1 local_e8 [8];
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  AnnotationCollector *local_88;
  Iterator local_80;
  Iterator local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pDVar25 = this->descriptor_;
  pOVar28 = &this->options_;
  local_1c4._4_8_ = printer;
  FVar9 = GetOptimizeFor(*(FileDescriptor **)(pDVar25 + 0x10),pOVar28,(bool *)0x0);
  if (((FVar9 != FileOptions_OptimizeMode_LITE_RUNTIME) && (*(int *)(pDVar25 + 0x78) == 0)) &&
     (*(int *)(pDVar25 + 4) == 0)) {
    return;
  }
  local_1b0.printer_ = (Printer *)local_1c4._4_8_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_1b0.vars_._M_t,&(this->variables_)._M_t);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x48) == '\x01') {
    local_d0._8_8_ = local_e0 + 8;
    local_e0._8_4_ = _S_red;
    local_d0._M_allocated_capacity = 0;
    local_b8 = (_Base_ptr)0x0;
    local_c0 = (_Base_ptr)local_d0._8_8_;
    SetUnknownFieldsVariable
              (this->descriptor_,pOVar28,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_e0);
    Formatter::AddMap(&local_1b0,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_e0);
    Formatter::operator()<>
              (&local_1b0,
               "size_t $classname$::ByteSizeLong() const {\n$annotate_bytesize$// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n  if ($have_unknown_fields$) {\n    total_size += ::$proto_ns$::internal::\n        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n  }\n  int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n  SetCachedSize(cached_size);\n  return total_size;\n}\n"
              );
    this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_e0;
    goto LAB_002a773b;
  }
  local_160 = pOVar28;
  if (1 < this->num_required_fields_) {
    Formatter::operator()<>
              (&local_1b0,
               "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
              );
    io::Printer::Indent(local_1b0.printer_);
    Formatter::operator()<>(&local_1b0,"size_t total_size = 0;\n");
    ppFVar15 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar15 != ppFVar3) {
      pFVar19 = extraout_RDX;
      do {
        this_00 = (cpp *)*ppFVar15;
        if (((byte)this_00[1] & 0x60) == 0x40) {
          FieldName_abi_cxx11_((string *)local_e0,this_00,pFVar19);
          Formatter::operator()(&local_1b0,"\nif (_internal_has_$1$()) {\n",(string *)local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._0_8_ != &local_d0) {
            operator_delete((void *)local_e0._0_8_);
          }
          io::Printer::Indent(local_1b0.printer_);
          PrintFieldComment<google::protobuf::FieldDescriptor>
                    (&local_1b0,(FieldDescriptor *)this_00);
          pFVar13 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)this_00);
          (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,local_1c4._4_8_);
          io::Printer::Outdent(local_1b0.printer_);
          Formatter::operator()<>(&local_1b0,"}\n");
          pFVar19 = extraout_RDX_00;
        }
        ppFVar15 = ppFVar15 + 1;
      } while (ppFVar15 != ppFVar3);
    }
    Formatter::operator()<>(&local_1b0,"\nreturn total_size;\n");
    pOVar28 = local_160;
    io::Printer::Outdent(local_1b0.printer_);
    Formatter::operator()<>(&local_1b0,"}\n");
  }
  Formatter::operator()<>
            (&local_1b0,
             "size_t $classname$::ByteSizeLong() const {\n$annotate_bytesize$// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
            );
  io::Printer::Indent(local_1b0.printer_);
  Formatter::operator()<>(&local_1b0,"size_t total_size = 0;\n\n");
  pDVar25 = this->descriptor_;
  if (0 < *(int *)(pDVar25 + 0x78)) {
    Formatter::operator()<>(&local_1b0,"total_size += _extensions_.ByteSize();\n\n");
    pDVar25 = this->descriptor_;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  SetUnknownFieldsVariable
            (pDVar25,pOVar28,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60);
  Formatter::AddMap(&local_1b0,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_60);
  if (this->num_required_fields_ < 2) {
    ppFVar15 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar15 != ppFVar3) {
      do {
        pFVar19 = *ppFVar15;
        if (((byte)pFVar19[1] & 0x60) == 0x40) {
          PrintFieldComment<google::protobuf::FieldDescriptor>(&local_1b0,pFVar19);
          FieldName_abi_cxx11_((string *)local_e0,(cpp *)pFVar19,field_00);
          Formatter::operator()(&local_1b0,"if (_internal_has_$1$()) {\n",(string *)local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._0_8_ != &local_d0) {
            operator_delete((void *)local_e0._0_8_);
          }
          io::Printer::Indent(local_1b0.printer_);
          pFVar13 = FieldGeneratorMap::get(&this->field_generators_,pFVar19);
          (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,local_1c4._4_8_);
          io::Printer::Outdent(local_1b0.printer_);
          Formatter::operator()<>(&local_1b0,"}\n");
        }
        ppFVar15 = ppFVar15 + 1;
      } while (ppFVar15 != ppFVar3);
    }
  }
  else {
    RequiredFieldsBitMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_130,this);
    has_bits_var.length_ = in_R9;
    has_bits_var.ptr_ = (char *)0xa;
    (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
              ((string *)local_e0,(_anonymous_namespace_ *)local_130,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1,true,has_bits_var);
    Formatter::operator()
              (&local_1b0,"if ($1$) {  // All required fields are present.\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ != &local_d0) {
      operator_delete((void *)local_e0._0_8_);
    }
    io::Printer::Indent(local_1b0.printer_);
    ppFVar15 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar15 != ppFVar3) {
      do {
        pFVar19 = *ppFVar15;
        if (((byte)pFVar19[1] & 0x60) == 0x40) {
          PrintFieldComment<google::protobuf::FieldDescriptor>(&local_1b0,pFVar19);
          pFVar13 = FieldGeneratorMap::get(&this->field_generators_,pFVar19);
          (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,local_1c4._4_8_);
          Formatter::operator()<>(&local_1b0,"\n");
        }
        ppFVar15 = ppFVar15 + 1;
      } while (ppFVar15 != ppFVar3);
    }
    io::Printer::Outdent(local_1b0.printer_);
    Formatter::operator()<>
              (&local_1b0,"} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n");
    if ((Printer *)local_130._0_8_ != (Printer *)0x0) {
      operator_delete((void *)local_130._0_8_);
    }
  }
  ppFVar15 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_178.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)0x0;
  local_178.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)0x0;
  local_178.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)0x0;
  __position_00._M_current =
       local_178.
       super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  for (; local_178.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current, ppFVar15 != ppFVar3;
      ppFVar15 = ppFVar15 + 1) {
    field = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*ppFVar15;
    local_e0._0_8_ = field;
    if ((local_178.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == __position_00._M_current) ||
       (pFVar19 = __position_00._M_current[-1].
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1],
       (((byte)*(FieldDescriptor *)(field->_M_local_buf + 1) ^ (byte)pFVar19[1]) & 0x60) != 0)) {
LAB_002a6d4d:
      if (__position_00._M_current ==
          local_178.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ::_M_realloc_insert<>(&local_178,__position_00);
        __position_00._M_current =
             local_178.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_178.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_178.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        __position_00._M_current =
             local_178.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else {
      iVar10 = HasBitIndex(this,pFVar19);
      iVar23 = iVar10 + 7;
      if (-1 < iVar10) {
        iVar23 = iVar10;
      }
      iVar23 = iVar23 >> 3;
      if (iVar10 == -1) {
        iVar23 = -1;
      }
      iVar11 = HasBitIndex(this,(FieldDescriptor *)field->_M_local_buf);
      iVar10 = iVar11 + 7;
      if (-1 < iVar11) {
        iVar10 = iVar11;
      }
      iVar10 = iVar10 >> 3;
      if (iVar11 == -1) {
        iVar10 = -1;
      }
      if (iVar23 != iVar10) goto LAB_002a6d4d;
    }
    __position._M_current =
         __position_00._M_current[-1].
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        __position_00._M_current[-1].
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)(__position_00._M_current + -1),__position,(FieldDescriptor **)local_e0);
    }
    else {
      *__position._M_current = (FieldDescriptor *)local_e0._0_8_;
      pppFVar1 = &__position_00._M_current[-1].
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    __position_00._M_current =
         local_178.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  lVar20 = (long)__position_00._M_current -
           (long)local_178.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  cached_has_word_index_00 = (int *)0xaaaaaaaaaaaaaaab;
  lVar24 = (lVar20 >> 3) * -0x5555555555555555 >> 2;
  pvVar17 = local_178.
            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar26 = lVar20;
  if (0 < lVar24) {
    pvVar17 = local_178.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar24 * 4;
    lVar24 = lVar24 + 1;
    __first._M_current =
         local_178.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 2;
    do {
      if (((byte)(*__first._M_current[-2].
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) == 0x40) {
        __first._M_current = __first._M_current + -2;
        goto LAB_002a6f0b;
      }
      if (((byte)(*__first._M_current[-1].
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) == 0x40) {
        __first._M_current = __first._M_current + -1;
        goto LAB_002a6f0b;
      }
      if (((byte)(*((__first._M_current)->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) == 0x40)
      goto LAB_002a6f0b;
      if (((byte)(*__first._M_current[1].
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) == 0x40) {
        __first._M_current = __first._M_current + 1;
        goto LAB_002a6f0b;
      }
      lVar24 = lVar24 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar24);
    lVar26 = (long)__position_00._M_current - (long)pvVar17;
  }
  lVar26 = (lVar26 >> 3) * -0x5555555555555555;
  if (lVar26 == 1) {
LAB_002a6ee0:
    __first._M_current = pvVar17;
    if (((byte)(*(pvVar17->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) != 0x40) {
      __first._M_current = __position_00._M_current;
    }
LAB_002a6f0b:
    pvVar17 = __first._M_current + 1;
    if (pvVar17 != __position_00._M_current && __first._M_current != __position_00._M_current) {
      do {
        ppFVar15 = (pvVar17->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        if (((byte)(*ppFVar15)[1] & 0x60) != 0x40) {
          ppFVar3 = ((__first._M_current)->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          ((__first._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start = ppFVar15;
          ppFVar15 = (pvVar17->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage;
          ((__first._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish =
               (pvVar17->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          ((__first._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = ppFVar15;
          (pvVar17->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar17->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar17->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (ppFVar3 != (pointer)0x0) {
            operator_delete(ppFVar3);
          }
          __first._M_current = __first._M_current + 1;
        }
        pvVar17 = pvVar17 + 1;
      } while (pvVar17 != __position_00._M_current);
      lVar20 = (long)local_178.
                     super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_178.
                     super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  else {
    if (lVar26 == 2) {
LAB_002a6ec8:
      __first._M_current = pvVar17;
      if (((byte)(*(pvVar17->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) != 0x40) {
        pvVar17 = pvVar17 + 1;
        goto LAB_002a6ee0;
      }
      goto LAB_002a6f0b;
    }
    __first._M_current = __position_00._M_current;
    if (lVar26 == 3) {
      __first._M_current = pvVar17;
      if (((byte)(*(pvVar17->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) != 0x40) {
        pvVar17 = pvVar17 + 1;
        goto LAB_002a6ec8;
      }
      goto LAB_002a6f0b;
    }
  }
  pOVar28 = local_160;
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::_M_erase(&local_178,__first,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)((long)&((local_178.
                          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar20));
  local_120._40_8_ = &this->has_bit_indices_;
  anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
            ((ColdChunkSkipper *)local_e0,pOVar28,&local_178,
             (vector<int,_std::allocator<int>_> *)local_120._40_8_,
             (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  local_1c4._0_4_ = -1;
  Formatter::operator()<>
            (&local_1b0,
             "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
            );
  if (local_178.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_178.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_138 = &this->field_generators_;
    pAVar27 = (AnnotationCollector *)0x0;
    do {
      pvVar7 = local_178.
               super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppFVar15 = local_178.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pAVar27].
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)local_178.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)pAVar27].
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar15) < 9) {
        local_1b4 = 0;
      }
      else {
        iVar23 = HasBitIndex(this,*ppFVar15);
        local_1b4 = CONCAT31((int3)(iVar23 + 0x1fU >> 8),iVar23 + 0x1fU < 0xffffffe0 && iVar23 != -1
                            );
      }
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      local_130._0_8_ = local_1c4._4_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_130 + 8),
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_c0);
      local_88 = pAVar27;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_130 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      pvVar17 = pvVar7 + (long)pAVar27;
      if ((char)local_1b4 != '\0') {
        uVar12 = anon_unknown_0::GenChunkMask
                           (pvVar17,(vector<int,_std::allocator<int>_> *)local_120._40_8_);
        hex.value = (ulong)uVar12;
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)local_130,hex);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,local_130._0_8_,(pointer)(local_130._8_8_ + local_130._0_8_)
                  );
        if (uVar12 == 0) {
LAB_002a713f:
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1127);
          pLVar14 = internal::LogMessage::operator<<
                              ((LogMessage *)local_130,"CHECK failed: (2) <= (popcnt(chunk_mask)): "
                              );
          internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar14);
          internal::LogMessage::~LogMessage((LogMessage *)local_130);
        }
        else {
          iVar23 = 0;
          uVar18 = uVar12;
          do {
            iVar23 = iVar23 + (uVar18 & 1);
            bVar8 = 1 < uVar18;
            uVar18 = uVar18 >> 1;
          } while (bVar8);
          if (iVar23 < 2) goto LAB_002a713f;
        }
        if (uVar12 != 0) {
          iVar23 = 0;
          do {
            iVar23 = iVar23 + (uVar12 & 1);
            bVar8 = 1 < uVar12;
            uVar12 = uVar12 >> 1;
          } while (bVar8);
          if (8 < iVar23) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_130,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x1128);
            pLVar14 = internal::LogMessage::operator<<
                                ((LogMessage *)local_130,
                                 "CHECK failed: (8) >= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar14);
            internal::LogMessage::~LogMessage((LogMessage *)local_130);
          }
        }
        uVar6 = local_1c4._0_4_;
        iVar10 = HasBitIndex(this,*(pvVar17->
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        iVar23 = iVar10 + 0x1f;
        if (-1 < iVar10) {
          iVar23 = iVar10;
        }
        iVar23 = iVar23 >> 5;
        if (iVar10 == -1) {
          iVar23 = -1;
        }
        if (uVar6 != iVar23) {
          local_1c4._0_4_ = iVar23;
          Formatter::operator()(&local_1b0,"cached_has_bits = _has_bits_[$1$];\n",(int *)local_1c4);
        }
        Formatter::operator()(&local_1b0,"if (cached_has_bits & 0x$1$u) {\n",&local_158);
        io::Printer::Indent(local_1b0.printer_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
      }
      ppFVar15 = (pvVar17->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar17->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppFVar15) {
        uVar29 = 0;
        do {
          pFVar19 = ppFVar15[uVar29];
          pFVar13 = FieldGeneratorMap::get(local_138,pFVar19);
          PrintFieldComment<google::protobuf::FieldDescriptor>(&local_1b0,pFVar19);
          FVar2 = pFVar19[1];
          bVar22 = (byte)FVar2 & 0x60;
          if (bVar22 == 0x60) {
            bVar8 = false;
          }
          else {
            if (((byte)FVar2 & 2) == 0) {
              if ((bVar22 == 0x20) && (*(char *)(*(long *)(pFVar19 + 0x10) + 0x3a) == '\x02')) {
                if ((((byte)FVar2 & 0x10) == 0) || (*(long *)(pFVar19 + 0x28) == 0))
                goto LAB_002a72cf;
              }
              else if (bVar22 == 0x40) goto LAB_002a72cf;
            }
            else {
LAB_002a72cf:
              if (*(char *)(*(long *)(pFVar19 + 0x38) + 0x4f) == '\0') {
                bVar8 = true;
                anon_unknown_0::PrintPresenceCheck
                          (&local_1b0,pFVar19,
                           *(vector<int,_std::allocator<int>_> **)local_120._40_8_,
                           (Printer *)local_1c4,cached_has_word_index_00);
                goto LAB_002a7355;
              }
            }
            local_130._0_8_ = local_120;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"this->","");
            bVar8 = anon_unknown_0::EmitFieldNonDefaultCondition
                              ((Printer *)local_1c4._4_8_,(string *)local_130,pFVar19);
            if ((Printer *)local_130._0_8_ != (Printer *)local_120) {
              operator_delete((void *)local_130._0_8_);
            }
          }
LAB_002a7355:
          (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,local_1c4._4_8_);
          if (bVar8 != false) {
            io::Printer::Outdent(local_1b0.printer_);
            Formatter::operator()<>(&local_1b0,"}\n\n");
          }
          if (bVar22 == 0x60) {
            Formatter::operator()<>(&local_1b0,"\n");
          }
          uVar29 = uVar29 + 1;
          ppFVar15 = (pvVar17->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar29 < (ulong)((long)(pvVar17->
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar15
                                 >> 3));
      }
      pAVar27 = local_88;
      if ((char)local_1b4 != '\0') {
        io::Printer::Outdent(local_1b0.printer_);
        Formatter::operator()<>(&local_1b0,"}\n");
      }
      bVar8 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                        ((ColdChunkSkipper *)local_e0,(int)pAVar27,(Printer *)local_1c4._4_8_);
      if (bVar8) {
        local_1c4._0_4_ = -1;
      }
      pAVar27 = (AnnotationCollector *)((long)&pAVar27->_vptr_AnnotationCollector + 1);
      pAVar16 = (AnnotationCollector *)
                (((long)local_178.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_178.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    } while (pAVar27 <= pAVar16 && (long)pAVar16 - (long)pAVar27 != 0);
  }
  local_158._M_string_length = (size_type)this->descriptor_;
  local_158._M_dataplus._M_p = local_158._M_dataplus._M_p & 0xffffffff00000000;
  local_80.idx = *(int *)(local_158._M_string_length + 0x6c);
  local_80.descriptor = (Descriptor *)local_158._M_string_length;
  while (bVar8 = operator==((Iterator *)&local_158,&local_80), !bVar8) {
    lVar20 = (long)(int)local_158._M_dataplus._M_p;
    lVar26 = *(long *)(local_158._M_string_length + 0x30);
    Formatter::operator()
              (&local_1b0,"switch ($1$_case()) {\n",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (lVar26 + 8 + lVar20 * 0x28));
    io::Printer::Indent(local_1b0.printer_);
    local_138 = (FieldGeneratorMap *)(lVar20 * 0x28 + lVar26);
    local_120._48_4_ = 0;
    local_70.idx = *(int *)((long)&local_138->descriptor_ + 4);
    local_e8 = (undefined1  [8])local_138;
    local_70.descriptor = (OneofDescriptor *)local_138;
    while (bVar8 = operator==((Iterator *)(local_120 + 0x30),&local_70), !bVar8) {
      pFVar19 = (FieldDescriptor *)
                ((((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&((FieldGeneratorMap *)((long)local_e8 + 0x20))->descriptor_)->_M_impl).
                 super__Vector_impl_data._M_start + (long)(int)local_120._48_4_ * 9);
      PrintFieldComment<google::protobuf::FieldDescriptor>(&local_1b0,pFVar19);
      UnderscoresToCamelCase((string *)local_130,*(string **)(pFVar19 + 8),true);
      Formatter::operator()(&local_1b0,"case k$1$: {\n",(string *)local_130);
      if ((Printer *)local_130._0_8_ != (Printer *)local_120) {
        operator_delete((void *)local_130._0_8_);
      }
      io::Printer::Indent(local_1b0.printer_);
      pFVar13 = FieldGeneratorMap::get(&this->field_generators_,pFVar19);
      (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,local_1c4._4_8_);
      Formatter::operator()<>(&local_1b0,"break;\n");
      io::Printer::Outdent(local_1b0.printer_);
      Formatter::operator()<>(&local_1b0,"}\n");
      local_120._48_4_ = local_120._48_4_ + 1;
    }
    puVar4 = (local_138->field_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var5._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>._M_head_impl =
         (puVar4->_M_t).
         super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
         ._M_t;
    local_130._0_8_ = (Printer *)local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_130,
               _Var5._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>.
               _M_head_impl,
               (long)puVar4[1]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
                     ._M_t +
               (long)_Var5._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>
                     ._M_head_impl);
    if ((pointer)local_130._8_8_ != (pointer)0x0) {
      puVar21 = (pointer)0x0;
      do {
        if ((byte)(*(char *)(local_130._0_8_ + (long)puVar21) + 0x9fU) < 0x1a) {
          *(char *)(local_130._0_8_ + (long)puVar21) =
               *(char *)(local_130._0_8_ + (long)puVar21) + -0x20;
        }
        puVar21 = (pointer)((long)puVar21 + 1);
      } while ((pointer)local_130._8_8_ != puVar21);
    }
    Formatter::operator()(&local_1b0,"case $1$_NOT_SET: {\n  break;\n}\n",(string *)local_130);
    if ((Printer *)local_130._0_8_ != (Printer *)local_120) {
      operator_delete((void *)local_130._0_8_);
    }
    io::Printer::Outdent(local_1b0.printer_);
    Formatter::operator()<>(&local_1b0,"}\n");
    local_158._M_dataplus._M_p._0_4_ = (int)local_158._M_dataplus._M_p + 1;
  }
  if (this->num_weak_fields_ != 0) {
    Formatter::operator()<>(&local_1b0,"total_size += _weak_field_map_.ByteSizeLong();\n");
  }
  FVar9 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),local_160,(bool *)0x0);
  if (FVar9 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    Formatter::operator()<>(&local_1b0,"if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
    Formatter::operator()<>(&local_1b0,"  total_size += $unknown_fields$.size();\n");
    Formatter::operator()<>(&local_1b0,"}\n");
    format_00 = 
    "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\nSetCachedSize(cached_size);\nreturn total_size;\n"
    ;
  }
  else {
    format_00 = "return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);\n";
  }
  Formatter::operator()<>(&local_1b0,format_00);
  io::Printer::Outdent(local_1b0.printer_);
  Formatter::operator()<>(&local_1b0,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_c0);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::~vector(&local_178);
  this_01 = &local_60;
LAB_002a773b:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(this_01);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1b0.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateByteSize(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    std::map<std::string, std::string> vars;
    SetUnknownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    format(
        "size_t $classname$::ByteSizeLong() const {\n"
        "$annotate_bytesize$"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n"
        "  if ($have_unknown_fields$) {\n"
        "    total_size += ::$proto_ns$::internal::\n"
        "        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n"
        "  }\n"
        "  int cached_size = "
        "::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "  SetCachedSize(cached_size);\n"
        "  return total_size;\n"
        "}\n");
    return;
  }

  if (num_required_fields_ > 1) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    format(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n");
    format.Indent();
    format("size_t total_size = 0;\n");
    for (auto field : optimized_order_) {
      if (field->is_required()) {
        format(
            "\n"
            "if (_internal_has_$1$()) {\n",
            FieldName(field));
        format.Indent();
        PrintFieldComment(format, field);
        field_generators_.get(field).GenerateByteSize(printer);
        format.Outdent();
        format("}\n");
      }
    }
    format(
        "\n"
        "return total_size;\n");
    format.Outdent();
    format("}\n");
  }

  format(
      "size_t $classname$::ByteSizeLong() const {\n"
      "$annotate_bytesize$"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n");
  format.Indent();
  format(
      "size_t total_size = 0;\n"
      "\n");

  if (descriptor_->extension_range_count() > 0) {
    format(
        "total_size += _extensions_.ByteSize();\n"
        "\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1) {
    // The fast path works if all required fields are present.
    const std::vector<uint32_t> masks_for_has_bits = RequiredFieldsBitMask();
    format("if ($1$) {  // All required fields are present.\n",
           ConditionalToCheckBitmasks(masks_for_has_bits));
    format.Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      field_generators_.get(field).GenerateByteSize(printer);
      format("\n");
    }
    format.Outdent();
    format(
        "} else {\n"  // the slow path
        "  total_size += RequiredFieldsByteSizeFallback();\n"
        "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      format("if (_internal_has_$1$()) {\n", FieldName(field));
      format.Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      format.Outdent();
      format("}\n");
    }
  }

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return a->label() == b->label() && HasByteIndex(a) == HasByteIndex(b);
      });

  // Remove chunks with required fields.
  chunks.erase(std::remove_if(chunks.begin(), chunks.end(), IsRequired),
               chunks.end());

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    const bool have_outer_if =
        chunk.size() > 1 && HasWordIndex(chunk[0]) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit checks for each of the fields we processed.
    for (int j = 0; j < chunk.size(); j++) {
      const FieldDescriptor* field = chunk[j];
      const FieldGenerator& generator = field_generators_.get(field);
      bool have_enclosing_if = false;
      bool need_extra_newline = false;

      PrintFieldComment(format, field);

      if (field->is_repeated()) {
        // No presence check is required.
        need_extra_newline = true;
      } else if (HasHasbit(field)) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
        have_enclosing_if = true;
      } else {
        // Without field presence: field is serialized only if it has a
        // non-default value.
        have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "this->", field);
      }

      generator.GenerateByteSize(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format(
            "}\n"
            "\n");
      }
      if (need_extra_newline) {
        format("\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      PrintFieldComment(format, field);
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateByteSize(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    format("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    // We go out of our way to put the computation of the uncommon path of
    // unknown fields in tail position. This allows for better code generation
    // of this function for simple protos.
    format(
        "return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);\n");
  } else {
    format("if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
    format("  total_size += $unknown_fields$.size();\n");
    format("}\n");

    // We update _cached_size_ even though this is a const method.  Because
    // const methods might be called concurrently this needs to be atomic
    // operations or the program is undefined.  In practice, since any
    // concurrent writes will be writing the exact same value, normal writes
    // will work on all common processors. We use a dedicated wrapper class to
    // abstract away the underlying atomic. This makes it easier on platforms
    // where even relaxed memory order might have perf impact to replace it with
    // ordinary loads and stores.
    format(
        "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "SetCachedSize(cached_size);\n"
        "return total_size;\n");
  }

  format.Outdent();
  format("}\n");
}